

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O0

void intgemm::anon_unknown_0::TestMultiplyBiasNew<intgemm::AVX512VNNI::Kernels8>
               (Index A_rows,Index width,Index B_cols,float int_tolerance,float float_tolerance,
               float MSE_float_tolerance,float MSE_int_tolerance)

{
  UnquantizeAndAddBiasAndWrite callback;
  UnquantizeAndAddBiasAndWrite callback_00;
  anon_class_8_1_8989cfb7 callback_01;
  anon_class_16_2_a84000ed callback_02;
  ostream *poVar1;
  float *pfVar2;
  float *pfVar3;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  result_type_conflict rVar4;
  float unquant_mult_forprep;
  AlignedVector<float> float_C;
  AlignedVector<signed_char> A_prep2;
  AlignedVector<float> slowint_C;
  AlignedVector<signed_char> B_quant;
  AlignedVector<float> test_C;
  AlignedVector<signed_char> B_prep;
  AlignedVector<unsigned_char> A_prep;
  float unquant_mult;
  float quant_mult;
  float alpha;
  float *it_2;
  float *__end2_2;
  float *__begin2_2;
  AlignedVector<float> *__range2_2;
  float *it_1;
  float *__end2_1;
  float *__begin2_1;
  AlignedVector<float> *__range2_1;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  AlignedVector<float> bias;
  AlignedVector<float> B;
  AlignedVector<float> A;
  ostringstream info;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffe808;
  Index cols;
  Index in_stack_ffffffffffffe810;
  float in_stack_ffffffffffffe814;
  uint8_t *in_stack_ffffffffffffe818;
  AlignedVector<float> *in_stack_ffffffffffffe820;
  undefined8 in_stack_ffffffffffffe830;
  Index IVar5;
  undefined8 in_stack_ffffffffffffe838;
  AlignedVector<float> *pAVar6;
  float *in_stack_ffffffffffffe840;
  float *in_stack_ffffffffffffe848;
  float *in_stack_ffffffffffffe850;
  float *in_stack_ffffffffffffe858;
  undefined4 in_stack_ffffffffffffe860;
  undefined4 in_stack_ffffffffffffe864;
  undefined4 in_stack_ffffffffffffe868;
  undefined4 in_stack_ffffffffffffe86c;
  float fVar7;
  string local_16b8 [32];
  UnquantizeAndAddBiasAndWrite local_1698;
  UnquantizeAndAddBiasAndWrite local_1680;
  float local_1664;
  AlignedVector<float> *local_1660;
  AlignedVector<float> local_1658;
  float *local_1648;
  AlignedVector<float> *pAStack_1640;
  AlignedVector<signed_char> local_1638;
  AlignedVector<float> local_1628;
  AlignedVector<signed_char> local_1618;
  AlignedVector<float> local_1608;
  AlignedVector<signed_char> local_15f8;
  AlignedVector<unsigned_char> local_15e8;
  float local_15d4;
  undefined4 local_15d0;
  float local_15cc;
  float *local_15c8;
  float *local_15c0;
  float *local_15b8;
  AlignedVector<float> *local_15b0;
  float *local_15a8;
  float *local_15a0;
  float *in_stack_ffffffffffffea78;
  float *local_1578;
  Index in_stack_ffffffffffffead4;
  Index in_stack_ffffffffffffead8;
  float in_stack_ffffffffffffeadc;
  int8_t *in_stack_ffffffffffffeae0;
  float *in_stack_ffffffffffffeae8;
  float in_stack_ffffffffffffeff0;
  float in_stack_ffffffffffffeff4;
  float in_stack_ffffffffffffeff8;
  float in_stack_ffffffffffffeffc;
  string *in_stack_fffffffffffff000;
  size_t in_stack_fffffffffffff008;
  float *in_stack_fffffffffffff010;
  float *in_stack_fffffffffffff018;
  float *in_stack_fffffffffffff020;
  Index in_stack_fffffffffffff3e0;
  Index in_stack_fffffffffffff3e4;
  int8_t *in_stack_fffffffffffff3e8;
  Index in_stack_fffffffffffff414;
  Index in_stack_fffffffffffff418;
  Index in_stack_fffffffffffff41c;
  int8_t *in_stack_fffffffffffff420;
  uint8_t *in_stack_fffffffffffff428;
  AlignedVector<float> local_1d8;
  AlignedVector<float> local_1c8;
  AlignedVector<float> local_1b8 [2];
  ostringstream local_198 [396];
  uint local_c;
  uint local_8;
  uint local_4;
  
  local_c = in_EDX;
  local_8 = in_ESI;
  local_4 = in_EDI;
  std::__cxx11::ostringstream::ostringstream(local_198);
  poVar1 = std::operator<<((ostream *)local_198,"8-bit AVX512VNNI");
  poVar1 = std::operator<<(poVar1,"\t");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_4);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_8);
  poVar1 = std::operator<<(poVar1,'\t');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  std::operator<<(poVar1,'\n');
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe820,(size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe820,(size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe820,(size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1e5aef);
  std::uniform_real_distribution<float>::uniform_real_distribution
            ((uniform_real_distribution<float> *)
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810),
             (float)((ulong)in_stack_ffffffffffffe808 >> 0x20),SUB84(in_stack_ffffffffffffe808,0));
  local_1578 = AlignedVector<float>::begin(local_1b8);
  pfVar2 = AlignedVector<float>::end(local_1b8);
  for (; local_1578 != pfVar2; local_1578 = local_1578 + 1) {
    in_stack_ffffffffffffea78 = local_1578;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810),
                       in_stack_ffffffffffffe808);
    *in_stack_ffffffffffffea78 = rVar4;
  }
  pAVar6 = &local_1c8;
  pfVar2 = AlignedVector<float>::begin(pAVar6);
  local_15a0 = AlignedVector<float>::end(pAVar6);
  for (; pfVar2 != local_15a0; pfVar2 = pfVar2 + 1) {
    local_15a8 = pfVar2;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810),
                       in_stack_ffffffffffffe808);
    *local_15a8 = rVar4;
  }
  local_15b0 = &local_1d8;
  local_15b8 = AlignedVector<float>::begin(local_15b0);
  local_15c0 = AlignedVector<float>::end(local_15b0);
  for (; IVar5 = (Index)((ulong)in_stack_ffffffffffffe830 >> 0x20), local_15b8 != local_15c0;
      local_15b8 = local_15b8 + 1) {
    local_15c8 = local_15b8;
    rVar4 = std::uniform_real_distribution<float>::operator()
                      ((uniform_real_distribution<float> *)
                       CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810),
                       in_stack_ffffffffffffe808);
    *local_15c8 = rVar4;
  }
  local_15cc = 2.0;
  local_15d0 = 0x427e0000;
  local_15d4 = 0.0002480005;
  AlignedVector<float>::size(local_1b8);
  cols = (Index)((ulong)in_stack_ffffffffffffe808 >> 0x20);
  AlignedVector<unsigned_char>::AlignedVector
            ((AlignedVector<unsigned_char> *)in_stack_ffffffffffffe820,
             (size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe820,
             (size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<unsigned_char>::begin(&local_15e8);
  AVX512BW::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe820,in_stack_ffffffffffffe818,in_stack_ffffffffffffe814,
             in_stack_ffffffffffffe810,cols);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_15f8);
  AVX512BW::Kernels8::PrepareB
            (in_stack_ffffffffffffeae8,in_stack_ffffffffffffeae0,in_stack_ffffffffffffeadc,
             in_stack_ffffffffffffead8,in_stack_ffffffffffffead4);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe820,(size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::size(&local_1c8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe820,
             (size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<signed_char>::begin(&local_1618);
  AlignedVector<float>::size(&local_1c8);
  AVX512BW::Kernels8::Quantize
            (in_stack_ffffffffffffea78,(int8_t *)pAVar6,(float)((ulong)pfVar2 >> 0x20),(Index)pfVar2
            );
  AlignedVector<float>::size(&local_1608);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe820,(size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::size(local_1b8);
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffe820,
             (size_t)in_stack_ffffffffffffe818,
             CONCAT44(in_stack_ffffffffffffe814,in_stack_ffffffffffffe810));
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<signed_char>::begin(&local_1638);
  AVX512BW::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffe820,(int8_t *)in_stack_ffffffffffffe818,
             in_stack_ffffffffffffe814,in_stack_ffffffffffffe810,cols);
  AlignedVector<signed_char>::begin(&local_1638);
  AlignedVector<signed_char>::begin(&local_1618);
  AlignedVector<float>::begin(&local_1628);
  local_1648 = &local_15d4;
  pAStack_1640 = &local_1d8;
  callback_02.unquant_mult._4_4_ = in_stack_ffffffffffffe864;
  callback_02.unquant_mult._0_4_ = in_stack_ffffffffffffe860;
  callback_02.bias._0_4_ = in_stack_ffffffffffffe868;
  callback_02.bias._4_4_ = in_stack_ffffffffffffe86c;
  pAVar6 = pAStack_1640;
  references::
  Multiply<signed_char,_signed_char,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:126:100),_nullptr>
            ((char *)in_stack_ffffffffffffe850,(char *)in_stack_ffffffffffffe848,
             in_stack_ffffffffffffe840,(Index)((ulong)in_stack_ffffffffffffe838 >> 0x20),
             (Index)in_stack_ffffffffffffe838,IVar5,callback_02);
  IVar5 = (Index)((ulong)in_stack_ffffffffffffe838 >> 0x20);
  AlignedVector<float>::size(&local_1608);
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffe820,(size_t)in_stack_ffffffffffffe818,(size_t)pAVar6);
  AlignedVector<float>::begin(local_1b8);
  AlignedVector<float>::begin(&local_1c8);
  AlignedVector<float>::begin(&local_1658);
  local_1660 = &local_1d8;
  callback_01.bias._4_4_ = in_stack_ffffffffffffe864;
  callback_01.bias._0_4_ = in_stack_ffffffffffffe860;
  references::
  Multiply<float,_float,_float,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kpu[P]intgemm_test_add127_test_cc:131:86),_nullptr>
            (in_stack_ffffffffffffe858,in_stack_ffffffffffffe850,in_stack_ffffffffffffe848,
             (Index)((ulong)in_stack_ffffffffffffe840 >> 0x20),(Index)in_stack_ffffffffffffe840,
             IVar5,callback_01);
  local_1664 = (-local_15cc * local_15cc) / 127.0;
  AlignedVector<signed_char>::begin(&local_15f8);
  fVar7 = local_1664;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1d8);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_1680,fVar7,pfVar2,pfVar3);
  callback.bias_addr = local_1680.output_addr;
  callback._0_8_ = local_1680.bias_addr;
  callback.output_addr = (float *)in_stack_ffffffffffffe820;
  AVX512VNNI::Kernels8::PrepareBias<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff3e8,in_stack_fffffffffffff3e4,in_stack_fffffffffffff3e0,callback)
  ;
  AlignedVector<unsigned_char>::begin(&local_15e8);
  AlignedVector<signed_char>::begin(&local_15f8);
  fVar7 = local_15d4;
  pfVar2 = AlignedVector<float>::begin(&local_1d8);
  pfVar3 = AlignedVector<float>::begin(&local_1608);
  callbacks::UnquantizeAndAddBiasAndWrite::UnquantizeAndAddBiasAndWrite
            (&local_1698,fVar7,pfVar2,pfVar3);
  callback_00.bias_addr = local_1698.output_addr;
  callback_00._0_8_ = local_1698.bias_addr;
  callback_00.output_addr = (float *)in_stack_ffffffffffffe820;
  AVX512VNNI::Kernels8::Multiply8Shift<intgemm::callbacks::UnquantizeAndAddBiasAndWrite>
            (in_stack_fffffffffffff428,in_stack_fffffffffffff420,in_stack_fffffffffffff41c,
             in_stack_fffffffffffff418,in_stack_fffffffffffff414,callback_00);
  AlignedVector<float>::begin(&local_1658);
  AlignedVector<float>::begin(&local_1628);
  pAVar6 = &local_1608;
  AlignedVector<float>::begin(pAVar6);
  AlignedVector<float>::size(pAVar6);
  std::__cxx11::ostringstream::str();
  CompareMSE(in_stack_fffffffffffff020,in_stack_fffffffffffff018,in_stack_fffffffffffff010,
             in_stack_fffffffffffff008,in_stack_fffffffffffff000,in_stack_ffffffffffffeffc,
             in_stack_ffffffffffffeff8,in_stack_ffffffffffffeff4,in_stack_ffffffffffffeff0);
  std::__cxx11::string::~string(local_16b8);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e6396);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e63a3);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e63b0);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e63bd);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e63ca);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e63d7);
  AlignedVector<unsigned_char>::~AlignedVector((AlignedVector<unsigned_char> *)0x1e63e4);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e63f1);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e63fe);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e640b);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void TestMultiplyBiasNew(Index A_rows, Index width, Index B_cols,
 float int_tolerance=.1, float float_tolerance=1, float MSE_float_tolerance=0, float MSE_int_tolerance=0) {
  std::ostringstream info;
  info << Routine::kName << "\t" << A_rows << '\t' << width << '\t' << B_cols << '\n';

  // Initialize A and B.
  AlignedVector<float> A(A_rows * width);
  AlignedVector<float> B(width * B_cols);
  AlignedVector<float> bias(B_cols);
  std::mt19937 gen;
  std::uniform_real_distribution<float> dist(-1.0f, 1.0f);
  for (auto& it : A) {
    it = dist(gen);
  }
  for (auto& it : B) {
    it = dist(gen);
  }
  for (auto& it : bias) {
    it = dist(gen);
  }

  float alpha = 2.0f;
  float quant_mult = 127.0f / alpha;
  float unquant_mult = 1.0f / (quant_mult*quant_mult);

  AlignedVector<uint8_t> A_prep(A.size());
  AlignedVector<int8_t> B_prep(B.size());
  Routine::PrepareA(A.begin(), A_prep.begin(), quant_mult, A_rows, width);
  Routine::PrepareB(B.begin(), B_prep.begin(), quant_mult, width, B_cols);

  AlignedVector<float> test_C(A_rows * B_cols);

  /*REFERENCE MULTIPLICATION
  *
  *
  */
  AlignedVector<int8_t> B_quant(B.size());
  Routine::Quantize(B.begin(), B_quant.begin(), quant_mult, static_cast<Index>(B.size()));
  AlignedVector<float> slowint_C(test_C.size());
  // Taking the original A_preparation which means A would be int8_t
  AlignedVector<int8_t> A_prep2(A.size());
  Routine::PrepareA(A.begin(), A_prep2.begin(), quant_mult, A_rows, width);
  references::Multiply(A_prep2.begin(), B_quant.begin(), slowint_C.begin(), A_rows, width, B_cols, [&](int32_t sum, const callbacks::OutputBufferInfo& info) {
    return sum * unquant_mult + bias[info.col_idx];
  });

  AlignedVector<float> float_C(test_C.size());
  references::Multiply(A.begin(), B.begin(), float_C.begin(), A_rows, width, B_cols, [&](double sum, const callbacks::OutputBufferInfo& info) {
    return static_cast<float>(sum) + bias[info.col_idx];
  });

  /*ACTUAL MULTIPLICATION
  *
  */
  float unquant_mult_forprep = (-1.0f)*(alpha)*(alpha)/(127.0f); //Minus one to invert add_ps later on
  Routine::PrepareBias(B_prep.begin(), width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult_forprep, bias.begin(), bias.begin()));
  //Routine::PrepareBias(B.begin(), bias.begin(), alpha, width, B_cols);
  Routine::Multiply8Shift(A_prep.begin(), B_prep.begin(), A_rows, width, B_cols, callbacks::UnquantizeAndAddBiasAndWrite(unquant_mult, bias.begin(), test_C.begin()));

  CompareMSE(float_C.begin(), slowint_C.begin(), test_C.begin(), test_C.size(), info.str(),
   int_tolerance, float_tolerance, MSE_float_tolerance, MSE_int_tolerance);
}